

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O2

bool __thiscall nuraft::timer_helper::timeout(timer_helper *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  std::mutex::lock(&this->lock_);
  if (this->first_event_fired_ == false) {
    this->first_event_fired_ = true;
    bVar2 = true;
  }
  else {
    bVar2 = ((double)CONCAT44(0x45300000,(int)(this->duration_us_ >> 0x20)) - 1.9342813113834067e+25
            ) + ((double)CONCAT44(0x43300000,(int)this->duration_us_) - 4503599627370496.0) <
            ((double)(lVar1 - (this->t_created_).__d.__r) / 1000000000.0) * 1000000.0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return bVar2;
}

Assistant:

bool timeout() {
        auto cur = std::chrono::system_clock::now();

        std::lock_guard<std::mutex> l(lock_);
        if (!first_event_fired_) {
            // First event, return `true` immediately.
            first_event_fired_ = true;
            return true;
        }

        std::chrono::duration<double> elapsed = cur - t_created_;
        return (duration_us_ < elapsed.count() * 1000000);
    }